

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,TokenList *args_3)

{
  Token directive;
  Token name;
  ConditionalBranchDirectiveSyntax *this_00;
  TokenList *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConditionalBranchDirectiveSyntax *)allocate(this,0x60,8);
  directive.kind = args_1->kind;
  directive._2_1_ = args_1->field_0x2;
  directive.numFlags.raw = (args_1->numFlags).raw;
  directive.rawLen = args_1->rawLen;
  directive.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  slang::syntax::ConditionalBranchDirectiveSyntax::ConditionalBranchDirectiveSyntax
            (this_00,*args,directive,name,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }